

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_unary.h
# Opt level: O0

vector<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_>_>
* __thiscall
lf::mesh::utils::internal::UnaryOpConjugate::operator()
          (vector<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_>_>
           *__return_storage_ptr__,UnaryOpConjugate *this,
          vector<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_>_>
          *u,int param_2)

{
  ulong uVar1;
  size_type sVar2;
  DenseBase<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_> *this_00;
  Matrix<std::complex<double>,1,2,1,1,2> *this_01;
  ConjugateReturnType local_70;
  ulong local_60;
  size_t i;
  allocator<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_> local_41;
  undefined1 local_40 [8];
  vector<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_>_>
  result;
  int param_2_local;
  vector<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_>_>
  *u_local;
  UnaryOpConjugate *this_local;
  
  result.
  super__Vector_base<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = param_2;
  sVar2 = std::
          vector<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_>_>
          ::size(u);
  std::allocator<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_>::allocator(&local_41);
  std::
  vector<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_>_>
  ::vector((vector<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_>_>
            *)local_40,sVar2,&local_41);
  std::allocator<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_>::~allocator(&local_41);
  local_60 = 0;
  while( true ) {
    uVar1 = local_60;
    sVar2 = std::
            vector<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_>_>
            ::size(u);
    if (sVar2 <= uVar1) break;
    this_00 = (DenseBase<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_> *)
              std::
              vector<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_>_>
              ::operator[](u,local_60);
    Eigen::DenseBase<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_>::conjugate
              (&local_70,this_00);
    this_01 = (Matrix<std::complex<double>,1,2,1,1,2> *)
              std::
              vector<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_>_>
              ::operator[]((vector<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_>_>
                            *)local_40,local_60);
    Eigen::Matrix<std::complex<double>,1,2,1,1,2>::operator=
              (this_01,(DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_conjugate_op<std::complex<double>_>,_const_Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_>_>
                        *)&local_70);
    local_60 = local_60 + 1;
  }
  std::
  vector<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_>_>
  ::vector(__return_storage_ptr__,
           (vector<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_>_>
            *)local_40);
  std::
  vector<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_>_>
  ::~vector((vector<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<std::complex<double>,_1,_2,_1,_1,_2>_>_>
             *)local_40);
  return __return_storage_ptr__;
}

Assistant:

auto operator()(const std::vector<Eigen::Matrix<S, R, C, O, MR, MC>>& u,
                  int /*unused*/) const {
    std::vector<Eigen::Matrix<S, R, C>> result(u.size());
    for (std::size_t i = 0; i < u.size(); ++i) {
      result[i] = u[i].conjugate();
    }
    return result;
  }